

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroEnum_Test<absl::lts_20250127::Cord>::TestBody
          (NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroEnum_Test<absl::lts_20250127::Cord>
           *this)

{
  bool bVar1;
  Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *this_00;
  ForeignEnum *rhs;
  Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *rhs_container;
  pointer *__ptr_2;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr_4;
  Cord *output;
  pointer *__ptr;
  string_view data;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  TestAllMapTypes rt_msg;
  TestAllMapTypes msg;
  AssertHelper local_238;
  AssertHelper local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_228;
  undefined1 local_220 [8];
  UntypedMapBase *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_210;
  AssertHelper local_200;
  UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>
  local_1f8;
  undefined1 local_1d8 [8];
  InternalMetadata local_1d0;
  undefined1 local_1c8 [64];
  Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> local_188 [4];
  undefined1 local_100 [80];
  Eq2Matcher local_b0 [136];
  
  proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes
            ((TestAllMapTypes *)local_100,(Arena *)0x0);
  rhs_container = (Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)local_220;
  local_220._0_4_ = 0;
  local_230.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_1d8,"static_cast<uint32_t>(FOREIGN_FOO)","0",(uint *)rhs_container,
             (int *)&local_230);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if ((UntypedMapBase *)local_1d0.ptr_ == (UntypedMapBase *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_1d0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x3aa,pcVar2);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if ((long *)CONCAT44(local_220._4_4_,local_220._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_220._4_4_,local_220._0_4_) + 8))();
    }
    if ((UntypedMapBase *)local_1d0.ptr_ == (UntypedMapBase *)0x0) goto LAB_008acba9;
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_1d0;
  }
  else {
    if ((UntypedMapBase *)local_1d0.ptr_ != (UntypedMapBase *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1d0.ptr_);
    }
    this_00 = protobuf::internal::
              TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>::MutableMap
                        ((TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>
                          *)(local_100 + 0x40));
    local_220._0_4_ = 0;
    Map<int,proto2_nofieldpresence_unittest::ForeignEnum>::TryEmplaceInternal<int_const&>
              ((pair<google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ForeignEnum>::iterator,_bool>
                *)local_1d8,this_00,(int *)local_220);
    *(undefined4 *)(CONCAT71(local_1d8._1_7_,local_1d8[0]) + 0xc) = 0;
    output = &(this->super_NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>).value_;
    bVar1 = MessageLite::SerializeToString((MessageLite *)local_100,output);
    local_220[0] = (internal)bVar1;
    local_218 = (UntypedMapBase *)0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&local_230);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1d8,(internal *)local_220,
                 (AssertionResult *)"TestSerialize(msg, &output_sink)","false","true",in_R9);
      rhs_container = (Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)0x3af;
      testing::internal::AssertHelper::AssertHelper
                (&local_238,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                 ,0x3af,(char *)CONCAT71(local_1d8._1_7_,local_1d8[0]));
      testing::internal::AssertHelper::operator=(&local_238,(Message *)&local_230);
      testing::internal::AssertHelper::~AssertHelper(&local_238);
      if ((undefined1 *)CONCAT71(local_1d8._1_7_,local_1d8[0]) != local_1c8) {
        operator_delete((undefined1 *)CONCAT71(local_1d8._1_7_,local_1d8[0]),local_1c8._0_8_ + 1);
      }
      if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
      }
      if (local_218 != (UntypedMapBase *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_218,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218)
        ;
      }
      if (!bVar1) goto LAB_008acba9;
    }
    absl::lts_20250127::Cord::operator_cast_to_string((string *)local_1d8,output);
    local_220[0] = (internal)((UntypedMapBase *)local_1d0.ptr_ != (UntypedMapBase *)0x0);
    local_218 = (UntypedMapBase *)0x0;
    if ((undefined1 *)CONCAT71(local_1d8._1_7_,local_1d8[0]) != local_1c8) {
      operator_delete((undefined1 *)CONCAT71(local_1d8._1_7_,local_1d8[0]),local_1c8._0_8_ + 1);
    }
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_218;
    if (local_220[0] != (internal)0x0) {
      if (local_218 != (UntypedMapBase *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_218);
      }
      proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes
                ((TestAllMapTypes *)local_1d8,(Arena *)0x0);
      absl::lts_20250127::Cord::operator_cast_to_string((string *)local_220,output);
      data._M_str._4_4_ = local_220._4_4_;
      data._M_str._0_4_ = local_220._0_4_;
      data._M_len = (size_t)local_218;
      bVar1 = MessageLite::ParseFromString((MessageLite *)local_1d8,data);
      local_230.data_._0_4_ = CONCAT31(local_230.data_._1_3_,bVar1);
      local_228 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_220._4_4_,local_220._0_4_) != &aStack_210) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_220._4_4_,local_220._0_4_),
                        aStack_210._M_allocated_capacity + 1);
      }
      if (local_230.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_238);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_220,(internal *)&local_230,
                   (AssertionResult *)"rt_msg.ParseFromString(this->GetOutput())","false","true",
                   in_R9);
        rhs_container = (Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)0x3b5;
        testing::internal::AssertHelper::AssertHelper
                  (&local_200,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                   ,0x3b5,(char *)CONCAT44(local_220._4_4_,local_220._0_4_));
        testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_238);
        testing::internal::AssertHelper::~AssertHelper(&local_200);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_220._4_4_,local_220._0_4_) != &aStack_210) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_220._4_4_,local_220._0_4_),
                          aStack_210._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_238.data_._4_4_,local_238.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_238.data_._4_4_,local_238.data_._0_4_) + 8))();
        }
      }
      if (local_228 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_228,local_228);
      }
      protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)(local_100 + 0x40))
      ;
      testing::
      UnorderedPointwise<testing::internal::Eq2Matcher,google::protobuf::Map<int,proto2_nofieldpresence_unittest::ForeignEnum>>
                (&local_1f8,(testing *)&local_238,local_b0,rhs_container);
      aStack_210._8_8_ =
           local_1f8.matchers_.
           super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      aStack_210._M_allocated_capacity =
           (size_type)
           local_1f8.matchers_.
           super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_218 = (UntypedMapBase *)
                  local_1f8.matchers_.
                  super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_1f8.matchers_.
      super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.matchers_.
      super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f8.matchers_.
      super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_220._0_4_ = local_1f8.match_flags_;
      protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)(local_1c8 + 0x30))
      ;
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,std::pair<int_const,proto2_nofieldpresence_unittest::ForeignEnum>>>>
      ::operator()(&local_230,local_220,
                   (Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)
                   "rt_msg.map_int32_foreign_enum()");
      if (local_218 != (UntypedMapBase *)0x0) {
        operator_delete(local_218,aStack_210._8_8_ - (long)local_218);
      }
      if ((UntypedMapBase *)
          local_1f8.matchers_.
          super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (UntypedMapBase *)0x0) {
        operator_delete(local_1f8.matchers_.
                        super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1f8.matchers_.
                              super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.matchers_.
                              super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_230.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)local_220);
        if (local_228 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar2 = (local_228->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_238,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                   ,0x3b7,pcVar2);
        testing::internal::AssertHelper::operator=(&local_238,(Message *)local_220);
        testing::internal::AssertHelper::~AssertHelper(&local_238);
        if ((long *)CONCAT44(local_220._4_4_,local_220._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_220._4_4_,local_220._0_4_) + 8))();
        }
      }
      if (local_228 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_228,local_228);
      }
      local_230.data_._0_4_ = 0;
      protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)(local_1c8 + 0x30))
      ;
      local_238.data_._0_4_ = 0;
      rhs = Map<int,_proto2_nofieldpresence_unittest::ForeignEnum>::at<int>
                      (local_188,(key_arg<int> *)&local_238);
      testing::internal::
      CmpHelperEQ<proto2_nofieldpresence_unittest::ForeignEnum,proto2_nofieldpresence_unittest::ForeignEnum>
                ((internal *)local_220,"FOREIGN_FOO","rt_msg.map_int32_foreign_enum().at(0)",
                 (ForeignEnum *)&local_230,rhs);
      if (local_220[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_230);
        if (local_218 == (UntypedMapBase *)0x0) {
          pcVar2 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar2 = *(char **)local_218;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_238,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                   ,0x3bb,pcVar2);
        testing::internal::AssertHelper::operator=(&local_238,(Message *)&local_230);
        testing::internal::AssertHelper::~AssertHelper(&local_238);
        if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
        }
      }
      if (local_218 != (UntypedMapBase *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_218,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218)
        ;
      }
      proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes
                ((TestAllMapTypes *)local_1d8);
      goto LAB_008acba9;
    }
    testing::Message::Message((Message *)&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)local_220,
               (AssertionResult *)"this->GetOutput().empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x3b1,(char *)CONCAT71(local_1d8._1_7_,local_1d8[0]));
    testing::internal::AssertHelper::operator=(&local_238,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    if ((undefined1 *)CONCAT71(local_1d8._1_7_,local_1d8[0]) != local_1c8) {
      operator_delete((undefined1 *)CONCAT71(local_1d8._1_7_,local_1d8[0]),local_1c8._0_8_ + 1);
    }
    if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
    }
    local_1d0.ptr_ = (intptr_t)local_218;
    if (local_218 == (UntypedMapBase *)0x0) goto LAB_008acba9;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1d0.ptr_);
LAB_008acba9:
  proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes((TestAllMapTypes *)local_100);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceMapSerializeTest, MapRoundTripZeroKeyZeroEnum) {
  TestAllMapTypes msg;
  ASSERT_EQ(static_cast<uint32_t>(FOREIGN_FOO), 0);
  (*msg.mutable_map_int32_foreign_enum())[0] = FOREIGN_FOO;

  // Test that message can serialize.
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(msg, &output_sink));
  // Maps with zero key or value fields are still serialized.
  ASSERT_FALSE(this->GetOutput().empty());

  // Test that message can roundtrip.
  TestAllMapTypes rt_msg;
  EXPECT_TRUE(rt_msg.ParseFromString(this->GetOutput()));
  EXPECT_THAT(rt_msg.map_int32_foreign_enum(),
              UnorderedPointwise(Eq(), msg.map_int32_foreign_enum()));

  // The map behaviour is pretty much the same whether the key/value field is
  // zero or not.
  EXPECT_EQ(FOREIGN_FOO, rt_msg.map_int32_foreign_enum().at(0));
}